

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpEventSubscribe.c
# Opt level: O1

UpnpEventSubscribe * UpnpEventSubscribe_new(void)

{
  UpnpEventSubscribe *pUVar1;
  UpnpString *pUVar2;
  
  pUVar1 = (UpnpEventSubscribe *)calloc(1,0x18);
  if (pUVar1 == (UpnpEventSubscribe *)0x0) {
    pUVar1 = (UpnpEventSubscribe *)0x0;
  }
  else {
    pUVar2 = UpnpString_new();
    pUVar1->m_SID = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_PublisherUrl = pUVar2;
  }
  return pUVar1;
}

Assistant:

UpnpEventSubscribe *UpnpEventSubscribe_new(void)
{
	struct s_UpnpEventSubscribe *p =
		calloc(1, sizeof(struct s_UpnpEventSubscribe));

	if (!p)
		return 0;

	/*p->m_ErrCode = 0;*/
	/*p->m_TimeOut = 0;*/
	p->m_SID = UpnpString_new();
	p->m_PublisherUrl = UpnpString_new();

	return (UpnpEventSubscribe *)p;
}